

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_interpolate(REF_INTERP ref_interp)

{
  REF_NODE ref_node;
  REF_NODE pRVar1;
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  REF_INT *proc;
  ulong uVar5;
  long lVar6;
  REF_DBL *pRVar7;
  undefined8 uVar8;
  REF_DBL *pRVar9;
  long lVar10;
  char *pcVar11;
  REF_DBL (*log_m) [6];
  long lVar12;
  REF_MPI pRVar13;
  uint uVar14;
  size_t __size;
  double dVar15;
  REF_INT n_donor;
  uint local_1dc;
  void *local_1d8;
  REF_MPI local_1d0;
  void *local_1c8;
  REF_INT *local_1c0;
  void *local_1b8;
  REF_INT *donor_ret;
  REF_INT *recept_node;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_log_m;
  REF_NODE local_188;
  REF_CELL local_180;
  long local_178;
  REF_INT *donor_cell;
  REF_INT nodes [27];
  REF_DBL log_parent_m [4] [6];
  
  pRVar13 = ref_interp->ref_mpi;
  ref_node = ref_interp->to_grid->node;
  pRVar1 = ref_interp->from_grid->node;
  uVar2 = ref_node->max;
  uVar3 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  uVar14 = 0;
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    if ((-1 < ref_node->global[uVar3]) && (ref_node->ref_mpi->id == ref_node->part[uVar3])) {
      uVar14 = uVar14 + 1;
      local_1dc = uVar14;
    }
  }
  if ((int)uVar14 < 0) {
    pcVar11 = "malloc recept_bary of REF_DBL negative";
    uVar8 = 0x263;
LAB_00167b72:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar8,
           "ref_metric_interpolate",pcVar11);
    return 1;
  }
  local_180 = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
  pvVar4 = malloc((ulong)(uVar14 * 4) << 3);
  if (pvVar4 == (void *)0x0) {
    pcVar11 = "malloc recept_bary of REF_DBL NULL";
    uVar8 = 0x263;
LAB_00167c92:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar8,
           "ref_metric_interpolate",pcVar11);
    return 2;
  }
  __size = (ulong)uVar14 << 2;
  local_1d8 = pvVar4;
  pvVar4 = malloc(__size);
  if (pvVar4 == (void *)0x0) {
    pcVar11 = "malloc recept_cell of REF_INT NULL";
    uVar8 = 0x264;
    goto LAB_00167c92;
  }
  local_1b8 = pvVar4;
  recept_node = (REF_INT *)malloc(__size);
  if (recept_node == (REF_INT *)0x0) {
    pcVar11 = "malloc recept_node of REF_INT NULL";
    uVar8 = 0x265;
    goto LAB_00167c92;
  }
  local_1c0 = recept_node;
  pvVar4 = malloc(__size);
  if (pvVar4 == (void *)0x0) {
    pcVar11 = "malloc recept_ret of REF_INT NULL";
    uVar8 = 0x266;
    goto LAB_00167c92;
  }
  local_1c8 = pvVar4;
  proc = (REF_INT *)malloc(__size);
  if (proc == (REF_INT *)0x0) {
    pcVar11 = "malloc recept_proc of REF_INT NULL";
    uVar8 = 0x267;
    goto LAB_00167c92;
  }
  local_1dc = 0;
  lVar6 = 0;
  uVar14 = 0;
  local_1d0 = pRVar13;
  local_188 = pRVar1;
  for (lVar12 = 0; pRVar13 = local_1d0, lVar12 < (int)uVar2; lVar12 = lVar12 + 1) {
    if ((-1 < ref_node->global[lVar12]) && (ref_node->ref_mpi->id == ref_node->part[lVar12])) {
      if (ref_interp->cell[lVar12] == -1) {
        pcVar11 = "node needs to be localized";
        uVar8 = 0x26c;
        goto LAB_00167b72;
      }
      local_178 = lVar6;
      uVar2 = ref_node_clip_bary4((REF_DBL *)((long)ref_interp->bary + lVar6),
                                  (REF_DBL *)((long)local_1d8 + (long)(int)(uVar14 * 4) * 8));
      if (uVar2 != 0) {
        uVar3 = (ulong)uVar2;
        pcVar11 = "clip";
        uVar8 = 0x26f;
        goto LAB_00167d45;
      }
      lVar6 = (long)(int)uVar14;
      proc[lVar6] = ref_interp->part[lVar12];
      *(REF_INT *)((long)local_1b8 + lVar6 * 4) = ref_interp->cell[lVar12];
      local_1c0[lVar6] = (REF_INT)lVar12;
      *(REF_INT *)((long)local_1c8 + lVar6 * 4) = local_1d0->id;
      uVar14 = uVar14 + 1;
      uVar2 = ref_node->max;
      lVar6 = local_178;
      local_1dc = uVar14;
    }
    lVar6 = lVar6 + 0x20;
  }
  uVar2 = ref_mpi_blindsend(local_1d0,proc,local_1b8,1,uVar14,&donor_cell,&n_donor,1);
  if (uVar2 == 0) {
    uVar2 = ref_mpi_blindsend(pRVar13,proc,local_1c8,1,uVar14,&donor_ret,&n_donor,1);
    if (uVar2 == 0) {
      uVar2 = ref_mpi_blindsend(pRVar13,proc,local_1c0,1,uVar14,&donor_node,&n_donor,1);
      if (uVar2 != 0) {
        pcVar11 = "blind send node";
        uVar8 = 0x280;
        uVar3 = (ulong)uVar2;
        goto LAB_00167d48;
      }
      uVar2 = ref_mpi_blindsend(pRVar13,proc,local_1d8,4,uVar14,&donor_bary,&n_donor,3);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x283,"ref_metric_interpolate",(ulong)uVar2,"blind send bary");
        return uVar2;
      }
      free(proc);
      free(local_1c8);
      free(local_1c0);
      free(local_1b8);
      free(local_1d8);
      uVar3 = (ulong)(uint)n_donor;
      if (n_donor < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x28b,"ref_metric_interpolate","malloc donor_log_m of REF_DBL negative");
        return 1;
      }
      local_1d8 = malloc(uVar3 * 0x30);
      if (local_1d8 == (void *)0x0) {
        pcVar11 = "malloc donor_log_m of REF_DBL NULL";
        uVar8 = 0x28b;
        local_1d8 = (void *)0x0;
        goto LAB_00167c92;
      }
      lVar6 = 0;
      while( true ) {
        log_m = log_parent_m;
        if ((int)uVar3 <= lVar6) break;
        uVar2 = ref_cell_nodes(local_180,donor_cell[lVar6],nodes);
        if (uVar2 != 0) {
          uVar3 = (ulong)uVar2;
          pcVar11 = "node needs to be localized";
          uVar8 = 0x28f;
          goto LAB_00167d45;
        }
        lVar12 = 0;
        while (lVar12 != 4) {
          uVar2 = ref_node_metric_get_log(local_188,nodes[lVar12],*log_m);
          lVar12 = lVar12 + 1;
          log_m = log_m + 1;
          if (uVar2 != 0) {
            uVar3 = (ulong)uVar2;
            pcVar11 = "log(parentM)";
            uVar8 = 0x292;
            goto LAB_00167d45;
          }
        }
        pRVar7 = log_parent_m[0];
        for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
          *(undefined8 *)((long)local_1d8 + lVar12 * 8 + lVar6 * 0x30) = 0;
          dVar15 = 0.0;
          pRVar9 = pRVar7;
          for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
            dVar15 = dVar15 + donor_bary[(ulong)((uint)lVar6 & 0x3fffffff) * 4 + lVar10] *
                              (*(REF_DBL (*) [6])pRVar9)[0];
            *(double *)((long)local_1d8 + lVar12 * 8 + lVar6 * 0x30) = dVar15;
            pRVar9 = (REF_DBL *)((long)pRVar9 + 0x30);
          }
          pRVar7 = pRVar7 + 1;
        }
        lVar6 = lVar6 + 1;
        uVar3 = (ulong)(uint)n_donor;
        pRVar13 = local_1d0;
      }
      free(donor_cell);
      free(donor_bary);
      uVar2 = ref_mpi_blindsend(pRVar13,donor_ret,local_1d8,6,n_donor,&recept_log_m,
                                (REF_INT *)&local_1dc,3);
      if (uVar2 == 0) {
        uVar2 = ref_mpi_blindsend(local_1d0,donor_ret,donor_node,1,n_donor,&recept_node,
                                  (REF_INT *)&local_1dc,1);
        if (uVar2 == 0) {
          free(local_1d8);
          free(donor_node);
          free(donor_ret);
          lVar6 = 0;
          lVar12 = 0;
          do {
            if ((int)local_1dc <= lVar12) {
              free(recept_node);
              free(recept_log_m);
              return 0;
            }
            uVar2 = ref_node_metric_set_log
                              (ref_node,recept_node[lVar12],(REF_DBL *)((long)recept_log_m + lVar6))
            ;
            lVar12 = lVar12 + 1;
            lVar6 = lVar6 + 0x30;
          } while (uVar2 == 0);
          uVar3 = (ulong)uVar2;
          pcVar11 = "set received log met";
          uVar8 = 0x2ab;
        }
        else {
          uVar3 = (ulong)uVar2;
          pcVar11 = "blind send node";
          uVar8 = 0x2a3;
        }
      }
      else {
        uVar3 = (ulong)uVar2;
        pcVar11 = "blind send bary";
        uVar8 = 0x2a0;
      }
    }
    else {
      uVar3 = (ulong)uVar2;
      pcVar11 = "blind send ret";
      uVar8 = 0x27d;
    }
  }
  else {
    uVar3 = (ulong)uVar2;
    pcVar11 = "blind send cell";
    uVar8 = 0x27a;
  }
LAB_00167d45:
  uVar2 = (uint)uVar3;
LAB_00167d48:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar8,
         "ref_metric_interpolate",uVar3,pcVar11);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolate(REF_INTERP ref_interp) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_cell;
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_INT node, ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL log_parent_m[4][6];
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_log_m, *donor_log_m, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");
      RSS(ref_node_clip_bary4(&(ref_interp->bary[4 * node]),
                              &(recept_bary[4 * n_recept])),
          "clip");
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_log_m, 6 * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (ibary = 0; ibary < 4; ibary++)
      RSS(ref_node_metric_get_log(from_node, nodes[ibary], log_parent_m[ibary]),
          "log(parentM)");
    for (im = 0; im < 6; im++) {
      donor_log_m[im + 6 * donation] = 0.0;
      for (ibary = 0; ibary < 4; ibary++) {
        donor_log_m[im + 6 * donation] +=
            donor_bary[ibary + 4 * donation] * log_parent_m[ibary][im];
      }
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_log_m, 6, n_donor,
                        (void **)(&recept_log_m), &n_recept, REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_log_m);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    RSS(ref_node_metric_set_log(to_node, node, &(recept_log_m[6 * receptor])),
        "set received log met");
  }

  ref_free(recept_node);
  ref_free(recept_log_m);

  return REF_SUCCESS;
}